

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O1

void __thiscall TTD::SnapshotExtractor::MarkVisitVar(SnapshotExtractor *this,Var var)

{
  long *plVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  DynamicObject *pDVar8;
  RecyclableObject *local_38;
  RecyclableObject *obj;
  
  if (var == (Var)0x0) {
    TTDAbort_unrecoverable_error("I don\'t think this should happen but not 100% sure.");
  }
  if (((ulong)var & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)var & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                       ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                       "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00935efe;
    *puVar6 = 0;
  }
  if ((ulong)var >> 0x32 == 0 && ((ulong)var & 0xffff000000000000) != 0x1000000000000) {
    pRVar7 = Js::UnsafeVarTo<Js::RecyclableObject>(var);
    if (pRVar7 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                         ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00935efe;
      *puVar6 = 0;
    }
    if (0x57 < (int)((pRVar7->type).ptr)->typeId) {
      BVar4 = Js::RecyclableObject::IsExternal(pRVar7);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00935efe:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      pRVar7 = Js::VarTo<Js::RecyclableObject>(var);
      BVar4 = Js::RecyclableObject::IsExternal(pRVar7);
      if (BVar4 == 0) {
        TTDAbort_unrecoverable_error("Not cool.");
      }
    }
  }
  bVar3 = JsSupport::IsVarTaggedInline(var);
  if (!bVar3) {
    bVar3 = JsSupport::IsVarPrimitiveKind(var);
    if (bVar3) {
      bVar3 = MarkTable::MarkAndTestAddr<(TTD::MarkTableTag)3>(&this->m_marks,var);
      if (bVar3) {
        pRVar7 = Js::VarTo<Js::RecyclableObject>(var);
        MarkVisitType(this,(pRVar7->type).ptr);
        return;
      }
    }
    else {
      bVar3 = JsSupport::IsVarComplexKind(var);
      if (!bVar3) {
        TTDAbort_unrecoverable_error("Shouldn\'t be anything else");
      }
      bVar3 = MarkTable::MarkAndTestAddr<(TTD::MarkTableTag)4>(&this->m_marks,var);
      if (bVar3) {
        local_38 = Js::VarTo<Js::RecyclableObject>(var);
        bVar3 = Js::DynamicType::Is(((local_38->type).ptr)->typeId);
        if (bVar3) {
          pDVar8 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(local_38);
          iVar5 = (**(code **)(**(long **)((pDVar8->super_RecyclableObject).type.ptr + 1) + 0x268))
                            ();
          if (iVar5 != 0) {
            plVar1 = *(long **)((pDVar8->super_RecyclableObject).type.ptr + 1);
            (**(code **)(*plVar1 + 0x80))(plVar1,pDVar8);
          }
        }
        MarkVisitType(this,(local_38->type).ptr);
        DListBase<Js::RecyclableObject_*,_RealCount>::Append<Memory::HeapAllocator>
                  ((DListBase<Js::RecyclableObject_*,_RealCount> *)&this->m_worklist,
                   (this->m_worklist).list.allocator,&local_38);
      }
    }
  }
  return;
}

Assistant:

void SnapshotExtractor::MarkVisitVar(Js::Var var)
    {
        TTDAssert(var != nullptr, "I don't think this should happen but not 100% sure.");
        TTDAssert(Js::JavascriptOperators::GetTypeId(var) < Js::TypeIds_Limit || Js::VarTo<Js::RecyclableObject>(var)->IsExternal(), "Not cool.");

        //We don't need to visit tagged things
        if(JsSupport::IsVarTaggedInline(var))
        {
            return;
        }

        if(JsSupport::IsVarPrimitiveKind(var))
        {
            if(this->m_marks.MarkAndTestAddr<MarkTableTag::PrimitiveObjectTag>(var))
            {
                Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(var);
                this->MarkVisitType(obj->GetType());
            }
        }
        else
        {
            TTDAssert(JsSupport::IsVarComplexKind(var), "Shouldn't be anything else");

            if(this->m_marks.MarkAndTestAddr<MarkTableTag::CompoundObjectTag>(var))
            {
                Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(var);

                //do this here instead of in mark visit type as it wants the dynamic object as well
                if(Js::DynamicType::Is(obj->GetTypeId()))
                {
                    Js::DynamicObject* dynObj = Js::VarTo<Js::DynamicObject>(obj);
                    if(dynObj->GetDynamicType()->GetTypeHandler()->IsDeferredTypeHandler())
                    {
                        dynObj->GetDynamicType()->GetTypeHandler()->EnsureObjectReady(dynObj);
                    }
                }
                this->MarkVisitType(obj->GetType());

                this->m_worklist.Enqueue(obj);
            }
        }
    }